

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_private.hh
# Opt level: O0

bool QPDF::Pipe::pipeStreamData
               (QPDF *qpdf,QPDFObjGen og,qpdf_offset_t offset,size_t length,QPDFObjectHandle *dict,
               bool is_root_metadata,Pipeline *pipeline,bool suppress_warnings,bool will_retry)

{
  bool bVar1;
  QPDFObjectHandle local_58;
  QPDFObjGen local_48;
  byte local_3b;
  byte local_3a;
  byte local_39;
  bool will_retry_local;
  bool suppress_warnings_local;
  QPDFObjectHandle *pQStack_38;
  bool is_root_metadata_local;
  QPDFObjectHandle *dict_local;
  size_t length_local;
  qpdf_offset_t offset_local;
  QPDF *qpdf_local;
  QPDFObjGen og_local;
  
  local_3a = suppress_warnings;
  local_3b = will_retry;
  local_48 = og;
  local_39 = is_root_metadata;
  pQStack_38 = dict;
  dict_local = (QPDFObjectHandle *)length;
  length_local = offset;
  offset_local = (qpdf_offset_t)qpdf;
  qpdf_local = (QPDF *)og;
  QPDFObjectHandle::QPDFObjectHandle(&local_58,dict);
  bVar1 = QPDF::pipeStreamData
                    (qpdf,local_48,offset,length,&local_58,(bool)(local_39 & 1),pipeline,
                     (bool)(local_3a & 1),(bool)(local_3b & 1));
  QPDFObjectHandle::~QPDFObjectHandle(&local_58);
  return bVar1;
}

Assistant:

static bool
    pipeStreamData(
        QPDF* qpdf,
        QPDFObjGen og,
        qpdf_offset_t offset,
        size_t length,
        QPDFObjectHandle dict,
        bool is_root_metadata,
        Pipeline* pipeline,
        bool suppress_warnings,
        bool will_retry)
    {
        return qpdf->pipeStreamData(
            og, offset, length, dict, is_root_metadata, pipeline, suppress_warnings, will_retry);
    }